

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

void __thiscall QSplitter::QSplitter(QSplitter *this,Orientation orientation,QWidget *parent)

{
  QSplitterPrivate *this_00;
  QSplitterPrivate *this_01;
  
  this_01 = (QSplitterPrivate *)operator_new(0x2b0);
  QSplitterPrivate::QSplitterPrivate(this_01);
  QFrame::QFrame(&this->super_QFrame,(QFramePrivate *)this_01,parent,(WindowFlags)0x0);
  *(undefined ***)&(this->super_QFrame).super_QWidget = &PTR_metaObject_007d4f08;
  *(undefined ***)&(this->super_QFrame).super_QWidget.super_QPaintDevice = &PTR__QSplitter_007d50c8;
  this_00 = *(QSplitterPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  this_00->orient = orientation;
  QSplitterPrivate::init(this_00,(EVP_PKEY_CTX *)this_01);
  return;
}

Assistant:

QSplitter::QSplitter(Qt::Orientation orientation, QWidget *parent)
    : QFrame(*new QSplitterPrivate, parent)
{
    Q_D(QSplitter);
    d->orient = orientation;
    d->init();
}